

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

OPTIONHANDLER_HANDLE saslclientio_retrieveoptions(CONCRETE_IO_HANDLE sasl_client_io)

{
  OPTIONHANDLER_RESULT OVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  OPTIONHANDLER_HANDLE pOStack_28;
  _Bool logtrace;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  CONCRETE_IO_HANDLE sasl_client_io_local;
  
  if (sasl_client_io == (CONCRETE_IO_HANDLE)0x0) {
    l = (LOGGER_LOG)0x0;
  }
  else {
    result = (OPTIONHANDLER_HANDLE)sasl_client_io;
    l = (LOGGER_LOG)
        OptionHandler_Create
                  (saslclientio_clone_option,saslclientio_destroy_option,saslclientio_setoption);
    if ((OPTIONHANDLER_HANDLE)l == (OPTIONHANDLER_HANDLE)0x0) {
      sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE *)xlogging_get_log_function();
      if (sasl_client_io_instance != (SASL_CLIENT_IO_INSTANCE *)0x0) {
        (*(code *)sasl_client_io_instance)
                  (0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                   ,"saslclientio_retrieveoptions",0x519,1,"unable to OptionHandler_Create");
      }
    }
    else {
      pOStack_28 = result;
      if ((*(byte *)&result[3].storage >> 1 & 1) != 0) {
        l_1._7_1_ = ((ulong)result[3].storage & 1) != 0;
        OVar1 = OptionHandler_AddOption((OPTIONHANDLER_HANDLE)l,"logtrace",(void *)((long)&l_1 + 7))
        ;
        if (OVar1 != OPTIONHANDLER_OK) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                      ,"saslclientio_retrieveoptions",0x528,1,"unable to add logtrace option");
          }
          OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

static OPTIONHANDLER_HANDLE saslclientio_retrieveoptions(CONCRETE_IO_HANDLE sasl_client_io)
{
    OPTIONHANDLER_HANDLE result;

    if (sasl_client_io == NULL)
    {
        /* Codes_SRS_SASLCLIENTIO_01_139: [ When `saslclientio_retrieveoptions` is called with NULL `sasl_client_io` it shall fail and return NULL. ]*/
        result = NULL;
    }
    else
    {
        /* Codes_SRS_SASLCLIENTIO_01_133: [ `saslclientio_retrieveoptions` shall create an option handler by calling `OptionHandler_Create`. ]*/
        result = OptionHandler_Create(saslclientio_clone_option, saslclientio_destroy_option, saslclientio_setoption);
        if (result == NULL)
        {
            /* Codes_SRS_SASLCLIENTIO_01_138: [ If `OptionHandler_AddOption` or `OptionHandler_Create` fails then `saslclientio_retrieveoptions` shall fail and return NULL. ]*/
            LogError("unable to OptionHandler_Create");
            /*return as is*/
        }
        else
        {
            SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)sasl_client_io;

            /*insert here work to add the options to "result" handle*/
            if (sasl_client_io_instance->is_trace_on_set)
            {
                bool logtrace = sasl_client_io_instance->is_trace_on ? true : false;
                /* Codes_SRS_SASLCLIENTIO_01_137: [ The options shall be added by calling `OptionHandler_AddOption`. ]*/
                if (OptionHandler_AddOption(result, "logtrace", &logtrace) != 0)
                {
                    /* Codes_SRS_SASLCLIENTIO_01_138: [ If `OptionHandler_AddOption` or `OptionHandler_Create` fails then `saslclientio_retrieveoptions` shall fail and return NULL. ]*/
                    LogError("unable to add logtrace option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
            }
        }
    }

    return result;
}